

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::handleInputGeometry
          (HlslParseContext *this,TSourceLoc *loc,TLayoutGeometry *geometry)

{
  TLayoutGeometry TVar1;
  bool bVar2;
  char *pcVar3;
  TLayoutGeometry *geometry_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if ((this->parsingEntrypointParameters & 1U) == 0) {
    this_local._7_1_ = true;
  }
  else {
    TVar1 = *geometry;
    if ((TVar1 - ElgPoints < 3) || (TVar1 == ElgTriangles || TVar1 == ElgTrianglesAdjacency)) {
      bVar2 = TIntermediate::setInputPrimitive
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,*geometry
                        );
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        pcVar3 = TQualifier::getGeometryString(*geometry);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"input primitive geometry redefinition",pcVar3,"");
        this_local._7_1_ = false;
      }
    }
    else {
      pcVar3 = TQualifier::getGeometryString(*geometry);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot apply to \'in\'",pcVar3,"");
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::handleInputGeometry(const TSourceLoc& loc, const TLayoutGeometry& geometry)
{
    // these can be declared on non-entry-points, in which case they lose their meaning
    if (! parsingEntrypointParameters)
        return true;

    switch (geometry) {
    case ElgPoints:             // fall through
    case ElgLines:              // ...
    case ElgTriangles:          // ...
    case ElgLinesAdjacency:     // ...
    case ElgTrianglesAdjacency: // ...
        if (! intermediate.setInputPrimitive(geometry)) {
            error(loc, "input primitive geometry redefinition", TQualifier::getGeometryString(geometry), "");
            return false;
        }
        break;

    default:
        error(loc, "cannot apply to 'in'", TQualifier::getGeometryString(geometry), "");
        return false;
    }

    return true;
}